

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::IntFromDescriptor
          (ChLinkPointFrameGeneric *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  undefined4 in_register_00000034;
  
  iVar2 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar2 != '\0') {
    iVar2 = 0;
    if ((this->c_x == true) &&
       ((this->constraint1).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      SVar1 = (this->constraint1).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)off_L);
      *pSVar3 = SVar1;
      iVar2 = 1;
    }
    if ((this->c_y == true) &&
       ((this->constraint2).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      SVar1 = (this->constraint2).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar2 + off_L));
      iVar2 = iVar2 + 1;
      *pSVar3 = SVar1;
    }
    if ((this->c_z == true) &&
       ((this->constraint3).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      SVar1 = (this->constraint3).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar2 + off_L));
      *pSVar3 = SVar1;
    }
  }
  return;
}

Assistant:

void ChLinkPointFrameGeneric::IntFromDescriptor(const unsigned int off_v,
                                                ChStateDelta& v,
                                                const unsigned int off_L,
                                                ChVectorDynamic<>& L) {
    if (!IsActive())
        return;

    int cnt = 0;
    if (c_x && this->constraint1.IsActive()) {
        L(off_L + cnt) = constraint1.Get_l_i();
        cnt++;
    }
    if (c_y && this->constraint2.IsActive()) {
        L(off_L + cnt) = constraint2.Get_l_i();
        cnt++;
    }
    if (c_z && this->constraint3.IsActive()) {
        L(off_L + cnt) = constraint3.Get_l_i();
        // cnt++;
    }
}